

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::RecyclerWeakReference<Js::PropertyGuard>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,RecyclerWeakReference<Js::PropertyGuard> **key,
          RecyclerWeakReference<Js::PropertyGuard> **value)

{
  Type *pTVar1;
  char *addr;
  uint uVar2;
  RecyclerWeakReference<Js::PropertyGuard> *pRVar3;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
  *pSVar4;
  int *piVar5;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
  *pSVar6;
  code *pcVar7;
  char cVar8;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_> WVar9;
  BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar10;
  bool bVar11;
  int iVar12;
  undefined4 *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_> local_68;
  RecyclerWeakReference<Js::PropertyGuard> **local_60;
  ulong local_58;
  BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_50;
  ulong local_48;
  uint local_3c;
  RecyclerWeakReference<Js::PropertyGuard> *local_38;
  
  lVar17 = *(long *)this;
  local_60 = value;
  if (lVar17 == 0) {
    BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar17 = *(long *)this;
  }
  uVar15 = (uint)((ulong)*key >> 3) | 1;
  local_48 = (ulong)uVar15;
  local_3c = BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket(uVar15,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar15 = *(uint *)(lVar17 + (ulong)local_3c * 4);
  local_50 = (BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar15 < 0) {
    cVar8 = (char)(uVar15 >> 0x18);
    uVar16 = 0;
  }
  else {
    local_58 = *(ulong *)(this + 8);
    uVar16 = 0;
    do {
      addr = (char *)(local_58 + (ulong)uVar15 * 0x10);
      pRVar3 = *(RecyclerWeakReference<Js::PropertyGuard> **)(local_58 + (ulong)uVar15 * 0x10);
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38 = pRVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if (local_38 == *key) {
        if (local_50->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_50->stats,uVar16);
        }
        pRVar3 = *local_60;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38 = pRVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        pRVar3 = local_38;
        Memory::Recycler::WBSetBit(addr);
        *(RecyclerWeakReference<Js::PropertyGuard> **)addr = pRVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        return uVar15;
      }
      uVar16 = uVar16 + 1;
      uVar15 = *(uint *)(addr + 8);
    } while (-1 < (int)uVar15);
    cVar8 = (char)(uVar15 >> 0x18);
  }
  pBVar10 = local_50;
  if (local_50->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_50->stats,uVar16);
  }
  if (cVar8 < '\0') {
    if (pBVar10->freeCount == 0) {
      uVar15 = pBVar10->count;
      if (uVar15 == pBVar10->size) {
        BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Resize(pBVar10);
        local_3c = BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::GetBucket((hash_t)local_48,pBVar10->bucketCount,pBVar10->modFunctionIndex);
        uVar15 = pBVar10->count;
      }
      uVar14 = (ulong)uVar15;
      pBVar10->count = uVar15 + 1;
      if (pBVar10->size < (int)(uVar15 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f1,"(count <= size)","count <= size");
        if (!bVar11) goto LAB_007cf434;
        *puVar13 = 0;
      }
      if (pBVar10->size <= (int)uVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f2,"(index < size)","index < size");
        if (!bVar11) goto LAB_007cf434;
        *puVar13 = 0;
      }
    }
    else {
      if (pBVar10->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar11) goto LAB_007cf434;
        *puVar13 = 0;
      }
      if (pBVar10->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar11) goto LAB_007cf434;
        *puVar13 = 0;
      }
      if (pBVar10->count <= pBVar10->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar11) {
LAB_007cf434:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar13 = 0;
      }
      uVar14 = (ulong)(uint)pBVar10->freeList;
      pTVar1 = &pBVar10->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar12 = BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((pBVar10->entries).ptr + pBVar10->freeList);
        pBVar10->freeList = iVar12;
      }
    }
    pSVar4 = (pBVar10->entries).ptr;
    lVar17 = (long)(int)uVar14;
    pSVar6 = pSVar4 + lVar17;
    pRVar3 = *key;
    local_58 = uVar14;
    local_48 = lVar17;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38 = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    pRVar3 = *local_60;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68.ptr = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    WVar9.ptr = local_68.ptr;
    Memory::Recycler::WBSetBit((char *)pSVar6);
    pBVar10 = local_50;
    pSVar4[lVar17].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
    .
    super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
    .value.ptr = WVar9.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar6);
    piVar5 = (pBVar10->buckets).ptr;
    pSVar6 = (pBVar10->entries).ptr;
    pSVar6[lVar17].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
    .
    super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
    .next = piVar5[local_3c];
    piVar5[local_3c] = (int)local_48;
    uVar16 = 0;
    uVar15 = (uint)local_58;
    uVar14 = local_58 & 0xffffffff;
    do {
      uVar2 = pSVar6[(int)uVar14].
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .
              super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
              .
              super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
              .next;
      uVar14 = (ulong)uVar2;
      uVar16 = uVar16 + 1;
    } while (uVar2 != 0xffffffff);
    if (pBVar10->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(pBVar10->stats,uVar16);
    }
  }
  return uVar15;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }